

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

void leveldb::PutLengthPrefixedSlice(string *dst,Slice *value)

{
  long lVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_type in_RDI;
  long in_FS_OFFSET;
  Slice *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  uint32_t v;
  string *in_stack_ffffffffffffffe0;
  
  v = (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Slice::size(in_stack_ffffffffffffffc8);
  PutVarint32(in_stack_ffffffffffffffe0,v);
  __s = Slice::data(in_stack_ffffffffffffffc8);
  Slice::size(in_stack_ffffffffffffffc8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_RSI,__s,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PutLengthPrefixedSlice(std::string* dst, const Slice& value) {
  PutVarint32(dst, value.size());
  dst->append(value.data(), value.size());
}